

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_> *this,void **vtt)

{
  TPZAutoPointer<TPZRefPattern> *in_RSI;
  TPZVec<long> *in_RDI;
  void **in_stack_00000048;
  TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_> *in_stack_00000050;
  TPZRefPattern *in_stack_ffffffffffffffe8;
  TPZAutoPointer<TPZRefPattern> *this_00;
  
  this_00 = in_RSI;
  TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_>::TPZGeoElRefLess
            (in_stack_00000050,in_stack_00000048);
  in_RDI->_vptr_TPZVec = (_func_int **)in_RSI->fRef;
  *(TPZReference **)((long)&in_RDI->_vptr_TPZVec + (long)in_RDI->_vptr_TPZVec[-0xc]) =
       in_RSI[5].fRef;
  TPZVec<long>::TPZVec(in_RDI,(int64_t)in_RSI);
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer(this_00,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern():TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),
TPZGeoElRefLess<TGeo>(), fSubEl(0), fRefPattern(0)
{
}